

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O1

void __thiscall
solitaire::events::EventsProcessorLeftMouseButtonUpEventTests::
tryAddCardOnFoundationPileAndClearHand(EventsProcessorLeftMouseButtonUpEventTests *this,PileId *id)

{
  TypedExpectation<void_(solitaire::piles::PileId)> *this_00;
  PileId local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  code *local_68;
  undefined8 uStack_60;
  MatcherBase<solitaire::piles::PileId> local_58;
  MockSpec<void_(solitaire::piles::PileId)> local_40;
  IgnoreArgs<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_smarkuck[P]Solitaire_written_using_TDD_approach_SolitaireLib_unitTests_sources_events_EventsProcessorTests_cpp:377:30)>
  local_20;
  
  local_7c = (PileId)id->t;
  testing::Matcher<solitaire::piles::PileId>::Matcher
            ((Matcher<solitaire::piles::PileId> *)&local_58,&local_7c);
  SolitaireMock::gmock_tryAddCardOnFoundationPile
            (&local_40,&(this->super_EventsProcessorTests).solitaireMock.super_SolitaireMock,
             (Matcher<solitaire::piles::PileId> *)&local_58);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_(solitaire::piles::PileId)>::InternalExpectedAt
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x178,"solitaireMock","tryAddCardOnFoundationPile(id)");
  local_20.function_impl.cardsToClear =
       (anon_class_8_1_ff5615ad_for_function_impl)&this->cardsInHand;
  local_68 = (code *)0x0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  std::function<void(solitaire::piles::PileId)>::operator=
            ((function<void(solitaire::piles::PileId)> *)&local_78,&local_20);
  testing::internal::TypedExpectation<void_(solitaire::piles::PileId)>::WillOnce
            (this_00,(Action<void_(solitaire::piles::PileId)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  testing::internal::MatcherBase<solitaire::piles::PileId>::~MatcherBase
            ((MatcherBase<solitaire::piles::PileId> *)&local_40.matchers_);
  testing::internal::MatcherBase<solitaire::piles::PileId>::~MatcherBase(&local_58);
  return;
}

Assistant:

void tryAddCardOnFoundationPileAndClearHand(const PileId id) {
        auto& cardsToClear = cardsInHand;
        EXPECT_CALL(solitaireMock, tryAddCardOnFoundationPile(id))
            .WillOnce(Invoke([&cardsToClear]() { cardsToClear.clear(); }));
    }